

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O0

void LabelDict::del_example_namespace(example *ec,namespace_index ns,features *fs)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  long in_RDX;
  byte in_SIL;
  v_array<unsigned_char> *in_RDI;
  features *unaff_retaddr;
  features *del_target;
  v_array<unsigned_char> *this;
  
  this = in_RDI;
  bVar1 = v_array<unsigned_char>::last(in_RDI);
  if (bVar1 == in_SIL) {
    sVar2 = features::size((features *)0x3d345f);
    sVar3 = features::size((features *)0x3d346e);
    if (sVar2 == sVar3) {
      v_array<unsigned_char>::pop(this);
    }
  }
  *(float *)((long)&this[0x345].end_array + 4) =
       *(float *)((long)&this[0x345].end_array + 4) - *(float *)(in_RDX + 0x60);
  sVar2 = features::size((features *)0x3d34b2);
  this[0x345]._begin = this[0x345]._begin + -sVar2;
  features::size((features *)0x3d34df);
  features::size((features *)0x3d34ed);
  features::truncate_to(unaff_retaddr,(size_t)this);
  *(float *)((long)in_RDI + (ulong)in_SIL * 0x68 + 0x80) =
       *(float *)((long)in_RDI + (ulong)in_SIL * 0x68 + 0x80) - *(float *)(in_RDX + 0x60);
  return;
}

Assistant:

void del_example_namespace(example& ec, namespace_index ns, features& fs)
{
  // print_update is called after this del_example_namespace,
  // so we need to keep the ec.num_features correct,
  // so shared features are included in the reported number of "current features"
  // ec.num_features -= numf;
  features& del_target = ec.feature_space[(size_t)ns];
  assert(del_target.size() >= fs.size());
  assert(ec.indices.size() > 0);
  if (ec.indices.last() == ns && ec.feature_space[(size_t)ns].size() == fs.size())
    ec.indices.pop();
  ec.total_sum_feat_sq -= fs.sum_feat_sq;
  ec.num_features -= fs.size();
  del_target.truncate_to(del_target.size() - fs.size());
  del_target.sum_feat_sq -= fs.sum_feat_sq;
}